

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_257,_true,_embree::sse42::VirtualCurveIntersectorK<4>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Scene *pSVar5;
  undefined8 uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  RayQueryContext *pRVar9;
  Scene *pSVar10;
  uint uVar11;
  ulong uVar12;
  RayQueryContext *pRVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  ulong uVar17;
  vint4 bi_1;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  float fVar39;
  float fVar40;
  vint4 ai;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar41;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar42;
  float fVar47;
  float fVar48;
  vint4 ai_3;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar49;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar50;
  float fVar55;
  float fVar56;
  vint4 ai_1;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar57;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar58;
  float fVar62;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar74;
  float fVar76;
  vint4 bi_3;
  float fVar78;
  undefined1 auVar72 [16];
  float fVar75;
  float fVar77;
  float fVar79;
  undefined1 auVar73 [16];
  float fVar80;
  float fVar81;
  float fVar84;
  float fVar86;
  vint4 bi;
  float fVar88;
  undefined1 auVar82 [16];
  float fVar85;
  float fVar87;
  undefined1 auVar83 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1088 [8];
  float fStack_1080;
  float fStack_107c;
  undefined1 local_1078 [16];
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  Intersectors *local_1058;
  size_t local_1050;
  Precalculations *local_1048;
  RayHitK<4> *local_1040;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  undefined1 local_f78 [3912];
  
  local_1048 = pre;
  local_1058 = This;
  pRVar13 = (RayQueryContext *)(local_f78 + 0x10);
  local_f78._0_8_ = root.ptr;
  local_f78._8_4_ = 0;
  fVar91 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar58 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar62 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_f98 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fStack_f94 = local_f98;
  fStack_f90 = local_f98;
  fStack_f8c = local_f98;
  local_fa8 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fStack_fa4 = local_fa8;
  fStack_fa0 = local_fa8;
  fStack_f9c = local_fa8;
  local_fb8 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fStack_fb4 = local_fb8;
  fStack_fb0 = local_fb8;
  fStack_fac = local_fb8;
  fVar67 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar68 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar69 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar80 = fVar67 * 0.99999964;
  fVar63 = fVar68 * 0.99999964;
  fVar70 = fVar69 * 0.99999964;
  fVar67 = fVar67 * 1.0000004;
  fVar68 = fVar68 * 1.0000004;
  fVar69 = fVar69 * 1.0000004;
  uVar15 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar12 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar29 = (tray->tnear).field_0.i[k];
  auVar38._4_4_ = iVar29;
  auVar38._0_4_ = iVar29;
  auVar38._8_4_ = iVar29;
  auVar38._12_4_ = iVar29;
  iVar29 = (tray->tfar).field_0.i[k];
  local_1040 = ray;
  local_1050 = k;
  local_f88 = fVar91;
  fStack_f84 = fVar91;
  fStack_f80 = fVar91;
  fStack_f7c = fVar91;
  local_fd8 = fVar58;
  fStack_fd4 = fVar58;
  fStack_fd0 = fVar58;
  fStack_fcc = fVar58;
  local_fe8 = fVar62;
  fStack_fe4 = fVar62;
  fStack_fe0 = fVar62;
  fStack_fdc = fVar62;
  local_ff8 = fVar67;
  fStack_ff4 = fVar67;
  fStack_ff0 = fVar67;
  fStack_fec = fVar67;
  local_1008 = fVar68;
  fStack_1004 = fVar68;
  fStack_1000 = fVar68;
  fStack_ffc = fVar68;
  local_1018 = fVar69;
  fStack_1014 = fVar69;
  fStack_1010 = fVar69;
  fStack_100c = fVar69;
  local_1028 = fVar70;
  fStack_1024 = fVar70;
  fStack_1020 = fVar70;
  fStack_101c = fVar70;
  local_1038 = fVar80;
  fStack_1034 = fVar80;
  fStack_1030 = fVar80;
  fStack_102c = fVar80;
  local_1068 = fVar63;
  fStack_1064 = fVar63;
  fStack_1060 = fVar63;
  fStack_105c = fVar63;
  local_1078 = auVar38;
  sVar16 = k;
  iVar30 = iVar29;
  iVar31 = iVar29;
  iVar32 = iVar29;
  fVar39 = fVar67;
  fVar40 = fVar67;
  fVar41 = fVar67;
  fVar42 = fVar68;
  fVar47 = fVar68;
  fVar48 = fVar68;
  fVar49 = fVar69;
  fVar50 = fVar69;
  fVar55 = fVar69;
  fVar92 = fVar91;
  fVar93 = fVar91;
  fVar94 = fVar91;
  fVar56 = fVar62;
  fVar57 = fVar62;
  fVar71 = fVar62;
  fVar75 = fVar58;
  fVar77 = fVar58;
  fVar79 = fVar58;
  fVar81 = fVar63;
  fVar85 = fVar63;
  fVar87 = fVar63;
  fVar74 = fVar70;
  fVar76 = fVar70;
  fVar78 = fVar70;
  fVar84 = fVar80;
  fVar86 = fVar80;
  fVar88 = fVar80;
  while (pRVar9 = pRVar13 + -1, pRVar13 = (RayQueryContext *)&pRVar13[-1].user,
        *(float *)(ray + sVar16 * 4 + 0x80) <= *(float *)&pRVar9->args &&
        *(float *)&pRVar9->args != *(float *)(ray + sVar16 * 4 + 0x80)) {
LAB_00287879:
    if (pRVar13 == (RayQueryContext *)local_f78) {
      return;
    }
  }
  pSVar10 = *(Scene **)pRVar13;
LAB_002872d2:
  if (((ulong)pSVar10 & 0xf) == 0) {
    pfVar1 = (float *)((long)&(pSVar10->super_AccelN).super_Accel.super_AccelData.bounds.bounds0.
                              upper.field_0 + uVar15);
    auVar18._0_4_ = (*pfVar1 - fVar91) * fVar80;
    auVar18._4_4_ = (pfVar1[1] - fVar92) * fVar84;
    auVar18._8_4_ = (pfVar1[2] - fVar93) * fVar86;
    auVar18._12_4_ = (pfVar1[3] - fVar94) * fVar88;
    pfVar1 = (float *)((long)&(pSVar10->super_AccelN).super_Accel.super_AccelData.bounds.bounds0.
                              upper.field_0 + uVar17);
    auVar33._0_4_ = (*pfVar1 - fVar58) * fVar63;
    auVar33._4_4_ = (pfVar1[1] - fVar75) * fVar81;
    auVar33._8_4_ = (pfVar1[2] - fVar77) * fVar85;
    auVar33._12_4_ = (pfVar1[3] - fVar79) * fVar87;
    auVar19 = maxps(auVar18,auVar33);
    pfVar1 = (float *)((long)&(pSVar10->super_AccelN).super_Accel.super_AccelData.bounds.bounds0.
                              upper.field_0 + uVar12);
    auVar34._0_4_ = (*pfVar1 - fVar62) * fVar70;
    auVar34._4_4_ = (pfVar1[1] - fVar56) * fVar74;
    auVar34._8_4_ = (pfVar1[2] - fVar57) * fVar76;
    auVar34._12_4_ = (pfVar1[3] - fVar71) * fVar78;
    pfVar1 = (float *)((long)&(pSVar10->super_AccelN).super_Accel.super_AccelData.bounds.bounds0.
                              upper.field_0 + (uVar15 ^ 0x10));
    auVar43._0_4_ = (*pfVar1 - fVar91) * fVar67;
    auVar43._4_4_ = (pfVar1[1] - fVar92) * fVar39;
    auVar43._8_4_ = (pfVar1[2] - fVar93) * fVar40;
    auVar43._12_4_ = (pfVar1[3] - fVar94) * fVar41;
    pfVar1 = (float *)((long)&(pSVar10->super_AccelN).super_Accel.super_AccelData.bounds.bounds0.
                              upper.field_0 + (uVar17 ^ 0x10));
    auVar51._0_4_ = (*pfVar1 - fVar58) * fVar68;
    auVar51._4_4_ = (pfVar1[1] - fVar75) * fVar42;
    auVar51._8_4_ = (pfVar1[2] - fVar77) * fVar47;
    auVar51._12_4_ = (pfVar1[3] - fVar79) * fVar48;
    auVar44 = minps(auVar43,auVar51);
    pfVar1 = (float *)((long)&(pSVar10->super_AccelN).super_Accel.super_AccelData.bounds.bounds0.
                              upper.field_0 + (uVar12 ^ 0x10));
    auVar52._0_4_ = (*pfVar1 - fVar62) * fVar69;
    auVar52._4_4_ = (pfVar1[1] - fVar56) * fVar49;
    auVar52._8_4_ = (pfVar1[2] - fVar57) * fVar50;
    auVar52._12_4_ = (pfVar1[3] - fVar71) * fVar55;
    auVar35 = maxps(auVar34,auVar38);
    _local_1088 = maxps(auVar19,auVar35);
    auVar8._4_4_ = iVar30;
    auVar8._0_4_ = iVar29;
    auVar8._8_4_ = iVar31;
    auVar8._12_4_ = iVar32;
    auVar19 = minps(auVar52,auVar8);
    auVar19 = minps(auVar44,auVar19);
    auVar20._4_4_ = -(uint)(local_1088._4_4_ <= auVar19._4_4_);
    auVar20._0_4_ = -(uint)(local_1088._0_4_ <= auVar19._0_4_);
    auVar20._8_4_ = -(uint)(local_1088._8_4_ <= auVar19._8_4_);
    auVar20._12_4_ = -(uint)(local_1088._12_4_ <= auVar19._12_4_);
    uVar11 = movmskps((int)k,auVar20);
  }
  else {
    if ((int)((ulong)pSVar10 & 0xf) != 2) {
      k = (size_t)context;
      (**(code **)((long)local_1058->leafIntersector +
                  (ulong)*(byte *)((ulong)pSVar10 & 0xfffffffffffffff0) * 0x40 + 0x10))
                (local_1048,ray,sVar16);
      iVar29 = *(int *)(local_1040 + local_1050 * 4 + 0x80);
      ray = local_1040;
      sVar16 = local_1050;
      iVar30 = iVar29;
      iVar31 = iVar29;
      iVar32 = iVar29;
      auVar38 = local_1078;
      fVar67 = local_ff8;
      fVar39 = fStack_ff4;
      fVar40 = fStack_ff0;
      fVar41 = fStack_fec;
      fVar68 = local_1008;
      fVar42 = fStack_1004;
      fVar47 = fStack_1000;
      fVar48 = fStack_ffc;
      fVar69 = local_1018;
      fVar49 = fStack_1014;
      fVar50 = fStack_1010;
      fVar55 = fStack_100c;
      fVar91 = local_f88;
      fVar92 = fStack_f84;
      fVar93 = fStack_f80;
      fVar94 = fStack_f7c;
      fVar62 = local_fe8;
      fVar56 = fStack_fe4;
      fVar57 = fStack_fe0;
      fVar71 = fStack_fdc;
      fVar58 = local_fd8;
      fVar75 = fStack_fd4;
      fVar77 = fStack_fd0;
      fVar79 = fStack_fcc;
      fVar63 = local_1068;
      fVar81 = fStack_1064;
      fVar85 = fStack_1060;
      fVar87 = fStack_105c;
      fVar70 = local_1028;
      fVar74 = fStack_1024;
      fVar76 = fStack_1020;
      fVar78 = fStack_101c;
      fVar80 = local_1038;
      fVar84 = fStack_1034;
      fVar86 = fStack_1030;
      fVar88 = fStack_102c;
      goto LAB_00287879;
    }
    uVar14 = (ulong)pSVar10 & 0xfffffffffffffff0;
    local_fc8 = *(float *)(uVar14 + 0x70);
    fStack_fc4 = *(float *)(uVar14 + 0x74);
    fStack_fc0 = *(float *)(uVar14 + 0x78);
    fStack_fbc = *(float *)(uVar14 + 0x7c);
    auVar90._0_4_ = local_fa8 * local_fc8 + local_fb8 * *(float *)(uVar14 + 0xa0);
    auVar90._4_4_ = fStack_fa4 * fStack_fc4 + fStack_fb4 * *(float *)(uVar14 + 0xa4);
    auVar90._8_4_ = fStack_fa0 * fStack_fc0 + fStack_fb0 * *(float *)(uVar14 + 0xa8);
    auVar90._12_4_ = fStack_f9c * fStack_fbc + fStack_fac * *(float *)(uVar14 + 0xac);
    auVar72._0_4_ =
         local_f98 * *(float *)(uVar14 + 0x20) +
         local_fa8 * *(float *)(uVar14 + 0x50) + local_fb8 * *(float *)(uVar14 + 0x80);
    auVar72._4_4_ =
         fStack_f94 * *(float *)(uVar14 + 0x24) +
         fStack_fa4 * *(float *)(uVar14 + 0x54) + fStack_fb4 * *(float *)(uVar14 + 0x84);
    auVar72._8_4_ =
         fStack_f90 * *(float *)(uVar14 + 0x28) +
         fStack_fa0 * *(float *)(uVar14 + 0x58) + fStack_fb0 * *(float *)(uVar14 + 0x88);
    auVar72._12_4_ =
         fStack_f8c * *(float *)(uVar14 + 0x2c) +
         fStack_f9c * *(float *)(uVar14 + 0x5c) + fStack_fac * *(float *)(uVar14 + 0x8c);
    auVar82._0_4_ =
         local_f98 * *(float *)(uVar14 + 0x30) +
         local_fa8 * *(float *)(uVar14 + 0x60) + local_fb8 * *(float *)(uVar14 + 0x90);
    auVar82._4_4_ =
         fStack_f94 * *(float *)(uVar14 + 0x34) +
         fStack_fa4 * *(float *)(uVar14 + 100) + fStack_fb4 * *(float *)(uVar14 + 0x94);
    auVar82._8_4_ =
         fStack_f90 * *(float *)(uVar14 + 0x38) +
         fStack_fa0 * *(float *)(uVar14 + 0x68) + fStack_fb0 * *(float *)(uVar14 + 0x98);
    auVar82._12_4_ =
         fStack_f8c * *(float *)(uVar14 + 0x3c) +
         fStack_f9c * *(float *)(uVar14 + 0x6c) + fStack_fac * *(float *)(uVar14 + 0x9c);
    fVar58 = (float)DAT_01f80d30;
    fVar62 = DAT_01f80d30._4_4_;
    fVar67 = DAT_01f80d30._8_4_;
    fVar68 = DAT_01f80d30._12_4_;
    auVar19._4_4_ = -(uint)(ABS(auVar72._4_4_) < fVar62);
    auVar19._0_4_ = -(uint)(ABS(auVar72._0_4_) < fVar58);
    auVar19._8_4_ = -(uint)(ABS(auVar72._8_4_) < fVar67);
    auVar19._12_4_ = -(uint)(ABS(auVar72._12_4_) < fVar68);
    auVar38 = blendvps(auVar72,_DAT_01f80d30,auVar19);
    auVar35._4_4_ = -(uint)(ABS(auVar82._4_4_) < fVar62);
    auVar35._0_4_ = -(uint)(ABS(auVar82._0_4_) < fVar58);
    auVar35._8_4_ = -(uint)(ABS(auVar82._8_4_) < fVar67);
    auVar35._12_4_ = -(uint)(ABS(auVar82._12_4_) < fVar68);
    auVar19 = blendvps(auVar82,_DAT_01f80d30,auVar35);
    auVar89._0_4_ = local_f98 * *(float *)(uVar14 + 0x40) + auVar90._0_4_;
    auVar89._4_4_ = fStack_f94 * *(float *)(uVar14 + 0x44) + auVar90._4_4_;
    auVar89._8_4_ = fStack_f90 * *(float *)(uVar14 + 0x48) + auVar90._8_4_;
    auVar89._12_4_ = fStack_f8c * *(float *)(uVar14 + 0x4c) + auVar90._12_4_;
    auVar44._4_4_ = -(uint)(ABS(auVar89._4_4_) < fVar62);
    auVar44._0_4_ = -(uint)(ABS(auVar89._0_4_) < fVar58);
    auVar44._8_4_ = -(uint)(ABS(auVar89._8_4_) < fVar67);
    auVar44._12_4_ = -(uint)(ABS(auVar89._12_4_) < fVar68);
    auVar35 = blendvps(auVar89,_DAT_01f80d30,auVar44);
    auVar44 = rcpps(auVar90,auVar38);
    fVar58 = auVar44._0_4_;
    fVar62 = auVar44._4_4_;
    fVar67 = auVar44._8_4_;
    fVar68 = auVar44._12_4_;
    fVar58 = (1.0 - auVar38._0_4_ * fVar58) * fVar58 + fVar58;
    fVar62 = (1.0 - auVar38._4_4_ * fVar62) * fVar62 + fVar62;
    fVar67 = (1.0 - auVar38._8_4_ * fVar67) * fVar67 + fVar67;
    fVar68 = (1.0 - auVar38._12_4_ * fVar68) * fVar68 + fVar68;
    auVar38 = rcpps(auVar44,auVar19);
    fVar71 = auVar38._0_4_;
    fVar75 = auVar38._4_4_;
    fVar77 = auVar38._8_4_;
    fVar79 = auVar38._12_4_;
    fVar71 = (1.0 - auVar19._0_4_ * fVar71) * fVar71 + fVar71;
    fVar75 = (1.0 - auVar19._4_4_ * fVar75) * fVar75 + fVar75;
    fVar77 = (1.0 - auVar19._8_4_ * fVar77) * fVar77 + fVar77;
    fVar79 = (1.0 - auVar19._12_4_ * fVar79) * fVar79 + fVar79;
    auVar38 = rcpps(auVar38,auVar35);
    fVar81 = auVar38._0_4_;
    fVar85 = auVar38._4_4_;
    fVar87 = auVar38._8_4_;
    fVar63 = auVar38._12_4_;
    fVar81 = (1.0 - auVar35._0_4_ * fVar81) * fVar81 + fVar81;
    fVar85 = (1.0 - auVar35._4_4_ * fVar85) * fVar85 + fVar85;
    fVar87 = (1.0 - auVar35._8_4_ * fVar87) * fVar87 + fVar87;
    fVar63 = (1.0 - auVar35._12_4_ * fVar63) * fVar63 + fVar63;
    fVar50 = (*(float *)(uVar14 + 0x20) * fVar91 +
             *(float *)(uVar14 + 0x50) * local_fd8 +
             *(float *)(uVar14 + 0x80) * local_fe8 + *(float *)(uVar14 + 0xb0)) * -fVar58;
    fVar55 = (*(float *)(uVar14 + 0x24) * fVar92 +
             *(float *)(uVar14 + 0x54) * fStack_fd4 +
             *(float *)(uVar14 + 0x84) * fStack_fe4 + *(float *)(uVar14 + 0xb4)) * -fVar62;
    fVar56 = (*(float *)(uVar14 + 0x28) * fVar93 +
             *(float *)(uVar14 + 0x58) * fStack_fd0 +
             *(float *)(uVar14 + 0x88) * fStack_fe0 + *(float *)(uVar14 + 0xb8)) * -fVar67;
    fVar57 = (*(float *)(uVar14 + 0x2c) * fVar94 +
             *(float *)(uVar14 + 0x5c) * fStack_fcc +
             *(float *)(uVar14 + 0x8c) * fStack_fdc + *(float *)(uVar14 + 0xbc)) * -fVar68;
    fVar42 = (*(float *)(uVar14 + 0x30) * fVar91 +
             *(float *)(uVar14 + 0x60) * local_fd8 +
             *(float *)(uVar14 + 0x90) * local_fe8 + *(float *)(uVar14 + 0xc0)) * -fVar71;
    fVar47 = (*(float *)(uVar14 + 0x34) * fVar92 +
             *(float *)(uVar14 + 100) * fStack_fd4 +
             *(float *)(uVar14 + 0x94) * fStack_fe4 + *(float *)(uVar14 + 0xc4)) * -fVar75;
    fVar48 = (*(float *)(uVar14 + 0x38) * fVar93 +
             *(float *)(uVar14 + 0x68) * fStack_fd0 +
             *(float *)(uVar14 + 0x98) * fStack_fe0 + *(float *)(uVar14 + 200)) * -fVar77;
    fVar49 = (*(float *)(uVar14 + 0x3c) * fVar94 +
             *(float *)(uVar14 + 0x6c) * fStack_fcc +
             *(float *)(uVar14 + 0x9c) * fStack_fdc + *(float *)(uVar14 + 0xcc)) * -fVar79;
    fVar69 = (*(float *)(uVar14 + 0x40) * fVar91 +
             local_fc8 * local_fd8 +
             *(float *)(uVar14 + 0xa0) * local_fe8 + *(float *)(uVar14 + 0xd0)) * -fVar81;
    fVar39 = (*(float *)(uVar14 + 0x44) * fVar92 +
             fStack_fc4 * fStack_fd4 +
             *(float *)(uVar14 + 0xa4) * fStack_fe4 + *(float *)(uVar14 + 0xd4)) * -fVar85;
    fVar40 = (*(float *)(uVar14 + 0x48) * fVar93 +
             fStack_fc0 * fStack_fd0 +
             *(float *)(uVar14 + 0xa8) * fStack_fe0 + *(float *)(uVar14 + 0xd8)) * -fVar87;
    fVar41 = (*(float *)(uVar14 + 0x4c) * fVar94 +
             fStack_fbc * fStack_fcc +
             *(float *)(uVar14 + 0xac) * fStack_fdc + *(float *)(uVar14 + 0xdc)) * -fVar63;
    fVar58 = fVar58 + fVar50;
    fVar62 = fVar62 + fVar55;
    fVar67 = fVar67 + fVar56;
    fVar68 = fVar68 + fVar57;
    fVar71 = fVar71 + fVar42;
    fVar75 = fVar75 + fVar47;
    fVar77 = fVar77 + fVar48;
    fVar79 = fVar79 + fVar49;
    fVar81 = fVar81 + fVar69;
    fVar85 = fVar85 + fVar39;
    fVar87 = fVar87 + fVar40;
    fVar63 = fVar63 + fVar41;
    auVar59._0_4_ =
         (uint)((int)fVar71 < (int)fVar42) * (int)fVar71 |
         (uint)((int)fVar71 >= (int)fVar42) * (int)fVar42;
    auVar59._4_4_ =
         (uint)((int)fVar75 < (int)fVar47) * (int)fVar75 |
         (uint)((int)fVar75 >= (int)fVar47) * (int)fVar47;
    auVar59._8_4_ =
         (uint)((int)fVar77 < (int)fVar48) * (int)fVar77 |
         (uint)((int)fVar77 >= (int)fVar48) * (int)fVar48;
    auVar59._12_4_ =
         (uint)((int)fVar79 < (int)fVar49) * (int)fVar79 |
         (uint)((int)fVar79 >= (int)fVar49) * (int)fVar49;
    auVar64._0_4_ =
         (uint)((int)fVar81 < (int)fVar69) * (int)fVar81 |
         (uint)((int)fVar81 >= (int)fVar69) * (int)fVar69;
    auVar64._4_4_ =
         (uint)((int)fVar85 < (int)fVar39) * (int)fVar85 |
         (uint)((int)fVar85 >= (int)fVar39) * (int)fVar39;
    auVar64._8_4_ =
         (uint)((int)fVar87 < (int)fVar40) * (int)fVar87 |
         (uint)((int)fVar87 >= (int)fVar40) * (int)fVar40;
    auVar64._12_4_ =
         (uint)((int)fVar63 < (int)fVar41) * (int)fVar63 |
         (uint)((int)fVar63 >= (int)fVar41) * (int)fVar41;
    auVar19 = maxps(auVar59,auVar64);
    auVar65._0_4_ =
         (uint)((int)fVar58 < (int)fVar50) * (int)fVar58 |
         (uint)((int)fVar58 >= (int)fVar50) * (int)fVar50;
    auVar65._4_4_ =
         (uint)((int)fVar62 < (int)fVar55) * (int)fVar62 |
         (uint)((int)fVar62 >= (int)fVar55) * (int)fVar55;
    auVar65._8_4_ =
         (uint)((int)fVar67 < (int)fVar56) * (int)fVar67 |
         (uint)((int)fVar67 >= (int)fVar56) * (int)fVar56;
    auVar65._12_4_ =
         (uint)((int)fVar68 < (int)fVar57) * (int)fVar68 |
         (uint)((int)fVar68 >= (int)fVar57) * (int)fVar57;
    auVar61._0_4_ =
         (uint)((int)fVar58 < (int)fVar50) * (int)fVar50 |
         (uint)((int)fVar58 >= (int)fVar50) * (int)fVar58;
    auVar61._4_4_ =
         (uint)((int)fVar62 < (int)fVar55) * (int)fVar55 |
         (uint)((int)fVar62 >= (int)fVar55) * (int)fVar62;
    auVar61._8_4_ =
         (uint)((int)fVar67 < (int)fVar56) * (int)fVar56 |
         (uint)((int)fVar67 >= (int)fVar56) * (int)fVar67;
    auVar61._12_4_ =
         (uint)((int)fVar68 < (int)fVar57) * (int)fVar57 |
         (uint)((int)fVar68 >= (int)fVar57) * (int)fVar68;
    auVar73._0_4_ =
         (uint)((int)fVar71 < (int)fVar42) * (int)fVar42 |
         (uint)((int)fVar71 >= (int)fVar42) * (int)fVar71;
    auVar73._4_4_ =
         (uint)((int)fVar75 < (int)fVar47) * (int)fVar47 |
         (uint)((int)fVar75 >= (int)fVar47) * (int)fVar75;
    auVar73._8_4_ =
         (uint)((int)fVar77 < (int)fVar48) * (int)fVar48 |
         (uint)((int)fVar77 >= (int)fVar48) * (int)fVar77;
    auVar73._12_4_ =
         (uint)((int)fVar79 < (int)fVar49) * (int)fVar49 |
         (uint)((int)fVar79 >= (int)fVar49) * (int)fVar79;
    auVar83._0_4_ =
         (uint)((int)fVar81 < (int)fVar69) * (int)fVar69 |
         (uint)((int)fVar81 >= (int)fVar69) * (int)fVar81;
    auVar83._4_4_ =
         (uint)((int)fVar85 < (int)fVar39) * (int)fVar39 |
         (uint)((int)fVar85 >= (int)fVar39) * (int)fVar85;
    auVar83._8_4_ =
         (uint)((int)fVar87 < (int)fVar40) * (int)fVar40 |
         (uint)((int)fVar87 >= (int)fVar40) * (int)fVar87;
    auVar83._12_4_ =
         (uint)((int)fVar63 < (int)fVar41) * (int)fVar41 |
         (uint)((int)fVar63 >= (int)fVar41) * (int)fVar63;
    auVar35 = minps(auVar73,auVar83);
    auVar38 = maxps(local_1078,auVar65);
    auVar38 = maxps(auVar38,auVar19);
    auVar45._4_4_ = iVar30;
    auVar45._0_4_ = iVar29;
    auVar45._8_4_ = iVar31;
    auVar45._12_4_ = iVar32;
    auVar19 = minps(auVar45,auVar61);
    auVar19 = minps(auVar19,auVar35);
    local_1088._0_4_ = auVar38._0_4_ * 0.99999964;
    local_1088._4_4_ = auVar38._4_4_ * 0.99999964;
    fStack_1080 = auVar38._8_4_ * 0.99999964;
    fStack_107c = auVar38._12_4_ * 0.99999964;
    auVar36._4_4_ = -(uint)((float)local_1088._4_4_ <= auVar19._4_4_ * 1.0000004);
    auVar36._0_4_ = -(uint)((float)local_1088._0_4_ <= auVar19._0_4_ * 1.0000004);
    auVar36._8_4_ = -(uint)(fStack_1080 <= auVar19._8_4_ * 1.0000004);
    auVar36._12_4_ = -(uint)(fStack_107c <= auVar19._12_4_ * 1.0000004);
    uVar11 = movmskps((int)k,auVar36);
    auVar38 = local_1078;
    fVar67 = local_ff8;
    fVar39 = fStack_ff4;
    fVar40 = fStack_ff0;
    fVar41 = fStack_fec;
    fVar68 = local_1008;
    fVar42 = fStack_1004;
    fVar47 = fStack_1000;
    fVar48 = fStack_ffc;
    fVar69 = local_1018;
    fVar49 = fStack_1014;
    fVar50 = fStack_1010;
    fVar55 = fStack_100c;
    fVar62 = local_fe8;
    fVar56 = fStack_fe4;
    fVar57 = fStack_fe0;
    fVar71 = fStack_fdc;
    fVar58 = local_fd8;
    fVar75 = fStack_fd4;
    fVar77 = fStack_fd0;
    fVar79 = fStack_fcc;
    fVar63 = local_1068;
    fVar81 = fStack_1064;
    fVar85 = fStack_1060;
    fVar87 = fStack_105c;
    fVar70 = local_1028;
    fVar74 = fStack_1024;
    fVar76 = fStack_1020;
    fVar78 = fStack_101c;
    fVar80 = local_1038;
    fVar84 = fStack_1034;
    fVar86 = fStack_1030;
    fVar88 = fStack_102c;
  }
  k = CONCAT44((int)(k >> 0x20),uVar11);
  if ((RayQueryContext *)k == (RayQueryContext *)0x0) goto LAB_00287879;
  uVar14 = (ulong)pSVar10 & 0xfffffffffffffff0;
  lVar7 = 0;
  if ((RayQueryContext *)k != (RayQueryContext *)0x0) {
    for (; (k >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
    }
  }
  pSVar10 = *(Scene **)(uVar14 + lVar7 * 8);
  uVar11 = uVar11 - 1 & uVar11;
  k = (size_t)pRVar13;
  if (uVar11 != 0) {
    uVar2 = *(uint *)(local_1088 + lVar7 * 4);
    lVar7 = 0;
    if (uVar11 != 0) {
      for (; (uVar11 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
      }
    }
    pSVar5 = *(Scene **)(uVar14 + lVar7 * 8);
    uVar3 = *(uint *)(local_1088 + lVar7 * 4);
    uVar11 = uVar11 - 1 & uVar11;
    if (uVar11 == 0) {
      k = (size_t)&pRVar13->args;
      if (uVar2 < uVar3) {
        pRVar13->scene = pSVar5;
        *(uint *)&pRVar13->user = uVar3;
        pRVar13 = (RayQueryContext *)k;
      }
      else {
        pRVar13->scene = pSVar10;
        *(uint *)&pRVar13->user = uVar2;
        pRVar13 = (RayQueryContext *)k;
        pSVar10 = pSVar5;
      }
    }
    else {
      auVar37._8_4_ = uVar2;
      auVar37._0_8_ = pSVar10;
      auVar37._12_4_ = 0;
      auVar53._8_4_ = uVar3;
      auVar53._0_8_ = pSVar5;
      auVar53._12_4_ = 0;
      lVar7 = 0;
      if (uVar11 != 0) {
        for (; (uVar11 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
        }
      }
      uVar6 = *(undefined8 *)(uVar14 + lVar7 * 8);
      iVar4 = *(int *)(local_1088 + lVar7 * 4);
      auVar46._8_4_ = iVar4;
      auVar46._0_8_ = uVar6;
      auVar46._12_4_ = 0;
      auVar21._8_4_ = -(uint)((int)uVar2 < (int)uVar3);
      uVar11 = uVar11 - 1 & uVar11;
      if (uVar11 == 0) {
        auVar21._4_4_ = auVar21._8_4_;
        auVar21._0_4_ = auVar21._8_4_;
        auVar21._12_4_ = auVar21._8_4_;
        auVar60._8_4_ = uVar3;
        auVar60._0_8_ = pSVar5;
        auVar60._12_4_ = 0;
        auVar35 = blendvps(auVar60,auVar37,auVar21);
        auVar19 = blendvps(auVar37,auVar53,auVar21);
        auVar22._8_4_ = -(uint)(auVar35._8_4_ < iVar4);
        auVar22._4_4_ = auVar22._8_4_;
        auVar22._0_4_ = auVar22._8_4_;
        auVar22._12_4_ = auVar22._8_4_;
        auVar54._8_4_ = iVar4;
        auVar54._0_8_ = uVar6;
        auVar54._12_4_ = 0;
        auVar44 = blendvps(auVar54,auVar35,auVar22);
        auVar61 = blendvps(auVar35,auVar46,auVar22);
        auVar23._8_4_ = -(uint)(auVar19._8_4_ < auVar61._8_4_);
        auVar23._4_4_ = auVar23._8_4_;
        auVar23._0_4_ = auVar23._8_4_;
        auVar23._12_4_ = auVar23._8_4_;
        auVar35 = blendvps(auVar61,auVar19,auVar23);
        auVar19 = blendvps(auVar19,auVar61,auVar23);
        pRVar13->scene = (Scene *)auVar19._0_8_;
        pRVar13->user = (RTCRayQueryContext *)auVar19._8_8_;
        *(undefined1 (*) [16])&pRVar13->args = auVar35;
        pSVar10 = auVar44._0_8_;
        pRVar13 = (RayQueryContext *)&pRVar13[1].user;
        k = (size_t)pRVar13;
      }
      else {
        lVar7 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
          }
        }
        auVar24._4_4_ = auVar21._8_4_;
        auVar24._0_4_ = auVar21._8_4_;
        auVar24._8_4_ = auVar21._8_4_;
        auVar24._12_4_ = auVar21._8_4_;
        auVar44 = blendvps(auVar53,auVar37,auVar24);
        auVar38 = blendvps(auVar37,auVar53,auVar24);
        auVar66._8_4_ = *(int *)(local_1088 + lVar7 * 4);
        auVar66._0_8_ = *(undefined8 *)(uVar14 + lVar7 * 8);
        auVar66._12_4_ = 0;
        auVar25._8_4_ = -(uint)(iVar4 < *(int *)(local_1088 + lVar7 * 4));
        auVar25._4_4_ = auVar25._8_4_;
        auVar25._0_4_ = auVar25._8_4_;
        auVar25._12_4_ = auVar25._8_4_;
        auVar35 = blendvps(auVar66,auVar46,auVar25);
        auVar19 = blendvps(auVar46,auVar66,auVar25);
        auVar26._8_4_ = -(uint)(auVar38._8_4_ < auVar19._8_4_);
        auVar26._4_4_ = auVar26._8_4_;
        auVar26._0_4_ = auVar26._8_4_;
        auVar26._12_4_ = auVar26._8_4_;
        auVar61 = blendvps(auVar19,auVar38,auVar26);
        auVar38 = blendvps(auVar38,auVar19,auVar26);
        auVar27._8_4_ = -(uint)(auVar44._8_4_ < auVar35._8_4_);
        auVar27._4_4_ = auVar27._8_4_;
        auVar27._0_4_ = auVar27._8_4_;
        auVar27._12_4_ = auVar27._8_4_;
        auVar19 = blendvps(auVar35,auVar44,auVar27);
        auVar44 = blendvps(auVar44,auVar35,auVar27);
        auVar28._8_4_ = -(uint)(auVar44._8_4_ < auVar61._8_4_);
        auVar28._4_4_ = auVar28._8_4_;
        auVar28._0_4_ = auVar28._8_4_;
        auVar28._12_4_ = auVar28._8_4_;
        auVar35 = blendvps(auVar61,auVar44,auVar28);
        auVar44 = blendvps(auVar44,auVar61,auVar28);
        pRVar13->scene = (Scene *)auVar38._0_8_;
        pRVar13->user = (RTCRayQueryContext *)auVar38._8_8_;
        *(undefined1 (*) [16])&pRVar13->args = auVar44;
        pRVar13[1].user = (RTCRayQueryContext *)auVar35._0_8_;
        pRVar13[1].args = (RTCIntersectArguments *)auVar35._8_8_;
        pSVar10 = auVar19._0_8_;
        pRVar13 = pRVar13 + 2;
        k = (size_t)pRVar13;
        auVar38 = local_1078;
        fVar63 = local_1068;
        fVar81 = fStack_1064;
        fVar85 = fStack_1060;
        fVar87 = fStack_105c;
      }
    }
  }
  goto LAB_002872d2;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }